

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O1

EStatusCode __thiscall
ShadingWriter::WriteShadingPatternObject
          (ShadingWriter *this,PDFMatrix *inShadingMatrix,ObjectIDType inPatternObjectId,
          ObjectIDType *outShadingObjectId)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EStatusCode EVar2;
  IndirectObjectsReferenceRegistry *this_00;
  ObjectIDType inObjectReference;
  DictionaryContext *this_01;
  string local_50;
  
  this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
  inObjectReference = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
  EVar2 = ObjectsContext::StartNewIndirectObject(this->mObjectsContext,inPatternObjectId);
  if (EVar2 == eSuccess) {
    this_01 = ObjectsContext::StartDictionary(this->mObjectsContext);
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Type","");
    DictionaryContext::WriteKey(this_01,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Pattern","");
    DictionaryContext::WriteNameValue(this_01,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"PatternType","");
    DictionaryContext::WriteKey(this_01,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    DictionaryContext::WriteIntegerValue(this_01,2);
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Matrix","");
    DictionaryContext::WriteKey(this_01,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    ObjectsContext::StartArray(this->mObjectsContext);
    ObjectsContext::WriteDouble(this->mObjectsContext,inShadingMatrix->a,eTokenSeparatorSpace);
    ObjectsContext::WriteDouble(this->mObjectsContext,inShadingMatrix->b,eTokenSeparatorSpace);
    ObjectsContext::WriteDouble(this->mObjectsContext,inShadingMatrix->c,eTokenSeparatorSpace);
    ObjectsContext::WriteDouble(this->mObjectsContext,inShadingMatrix->d,eTokenSeparatorSpace);
    ObjectsContext::WriteDouble(this->mObjectsContext,inShadingMatrix->e,eTokenSeparatorSpace);
    ObjectsContext::WriteDouble(this->mObjectsContext,inShadingMatrix->f,eTokenSeparatorSpace);
    ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Shading","");
    DictionaryContext::WriteKey(this_01,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    DictionaryContext::WriteNewObjectReferenceValue(this_01,inObjectReference);
    EVar2 = ObjectsContext::EndDictionary(this->mObjectsContext,this_01);
    if (EVar2 == eSuccess) {
      ObjectsContext::EndIndirectObject(this->mObjectsContext);
    }
    *outShadingObjectId = inObjectReference;
  }
  return EVar2;
}

Assistant:

EStatusCode ShadingWriter::WriteShadingPatternObject(
    const PDFMatrix& inShadingMatrix,
    ObjectIDType inPatternObjectId,
    ObjectIDType& outShadingObjectId
) {
    ObjectIDType shadingObjectId = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

    EStatusCode status = mObjectsContext->StartNewIndirectObject(inPatternObjectId);
    if(status != eSuccess)
        return status;
    DictionaryContext* patternDict = mObjectsContext->StartDictionary();
    patternDict->WriteKey("Type");
    patternDict->WriteNameValue("Pattern");
    patternDict->WriteKey("PatternType");
    patternDict->WriteIntegerValue(2);
    patternDict->WriteKey("Matrix");
    mObjectsContext->StartArray();
    mObjectsContext->WriteDouble(inShadingMatrix.a);
    mObjectsContext->WriteDouble(inShadingMatrix.b);
    mObjectsContext->WriteDouble(inShadingMatrix.c);
    mObjectsContext->WriteDouble(inShadingMatrix.d);
    mObjectsContext->WriteDouble(inShadingMatrix.e);
    mObjectsContext->WriteDouble(inShadingMatrix.f);
    mObjectsContext->EndArray(eTokenSeparatorEndLine);
    patternDict->WriteKey("Shading");
    patternDict->WriteNewObjectReferenceValue(shadingObjectId);
    status = mObjectsContext->EndDictionary(patternDict);
    if(eSuccess == status)
        mObjectsContext->EndIndirectObject();

    outShadingObjectId = shadingObjectId;

    return status;
}